

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

void __thiscall
ON_Font::Internal_ClearName
          (ON_Font *this,bool bClearFamilyName,bool bClearFaceName,bool bClearPostScriptName,
          bool bClearWindowsLogfontName)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,bClearFamilyName) != 0) {
    ON_wString::operator=(&this->m_loc_family_name,&ON_wString::EmptyString);
    ON_wString::operator=(&this->m_en_family_name,&ON_wString::EmptyString);
  }
  if (bClearFaceName) {
    ON_wString::operator=(&this->m_loc_face_name,&ON_wString::EmptyString);
    ON_wString::operator=(&this->m_en_face_name,&ON_wString::EmptyString);
  }
  if (bClearPostScriptName) {
    ON_wString::operator=(&this->m_loc_postscript_name,&ON_wString::EmptyString);
    ON_wString::operator=(&this->m_en_postscript_name,&ON_wString::EmptyString);
  }
  if (bClearWindowsLogfontName) {
    ON_wString::operator=(&this->m_loc_windows_logfont_name,&ON_wString::EmptyString);
    ON_wString::operator=(&this->m_en_windows_logfont_name,&ON_wString::EmptyString);
    this->m_quartet_member = Unset;
  }
  return;
}

Assistant:

void ON_Font::Internal_ClearName(
  bool bClearFamilyName,
  bool bClearFaceName,
  bool bClearPostScriptName,
  bool bClearWindowsLogfontName
)
{
  if (bClearFamilyName)
  {
    m_loc_family_name = ON_wString::EmptyString;
    m_en_family_name = ON_wString::EmptyString;
  }
  if (bClearFaceName)
  {
    m_loc_face_name = ON_wString::EmptyString;
    m_en_face_name = ON_wString::EmptyString;
  }
  if (bClearPostScriptName)
  {
    m_loc_postscript_name = ON_wString::EmptyString;
    m_en_postscript_name = ON_wString::EmptyString;
  }
  if (bClearWindowsLogfontName)
  {
    m_loc_windows_logfont_name = ON_wString::EmptyString;
    m_en_windows_logfont_name = ON_wString::EmptyString;
    m_quartet_member = ON_FontFaceQuartet::Member::Unset;
  }
}